

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initializeGameBoard.cpp
# Opt level: O2

list<Player,_std::allocator<Player>_> * initializeGameBoard_abi_cxx11_(void)

{
  int iVar1;
  ostream *poVar2;
  int playernum;
  _List_node_base *in_RDI;
  bool bVar3;
  _List_base<Player,_std::allocator<Player>_> local_210;
  GameBoard board;
  
  iVar1 = rand();
  playernum = iVar1 % 7 + 2;
  in_RDI->_M_prev = in_RDI;
  in_RDI->_M_next = in_RDI;
  in_RDI[1]._M_next = (_List_node_base *)0x0;
  iVar1 = 0;
  if (0 < playernum) {
    iVar1 = playernum;
  }
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    Player::Player((Player *)&board,0x28,0x3c);
    std::__cxx11::list<Player,_std::allocator<Player>_>::push_back
              ((list<Player,_std::allocator<Player>_> *)in_RDI,(Player *)&board);
    Player::~Player((Player *)&board);
  }
  std::__cxx11::list<Player,_std::allocator<Player>_>::list
            ((list<Player,_std::allocator<Player>_> *)&local_210,
             (list<Player,_std::allocator<Player>_> *)in_RDI);
  GameBoard::GameBoard
            (&board,playernum,0x28,0x3c,(list<Player,_std::allocator<Player>_> *)&local_210);
  std::__cxx11::_List_base<Player,_std::allocator<Player>_>::_M_clear(&local_210);
  poVar2 = std::operator<<((ostream *)&std::cout,"Starting game!");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  GameBoard::printGameStatistics(&board);
  GameBoard::~GameBoard(&board);
  return (list<Player,_std::allocator<Player>_> *)in_RDI;
}

Assistant:

list<Player> initializeGameBoard()                                           //initializes players and their number, min and max number of cards for each player(same)
{
    int playernum = rand()%7 + 2;                                            //random num from [2, 8]
    int min = 40;                                                            //default limits
    int max = 60;

    list<Player> myplayers;
    int i;

    for (i=0; i<playernum; i++)                                              //create playernum players
    {
        //passes limits for decks and creates them in player constructor
        Player play(min, max);
        myplayers.push_back(play);
    }

    GameBoard board(playernum, min, max, myplayers);                         //create board
    cout << "Starting game!"<<endl<<endl;
    board.printGameStatistics();                                             //print stats

    return myplayers;
}